

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

int condvar_wait(worker_config_conflict *c,int *flag)

{
  uv_mutex_t *mutex;
  int iVar1;
  undefined8 *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_28;
  
  mutex = &c->mutex;
  uv_mutex_lock(mutex);
  uv_sem_post(&c->sem_waiting);
  do {
    uv_cond_wait(&c->cond,mutex);
  } while (*flag == 0);
  local_28 = 1;
  if (*flag == 1) {
    uv_mutex_unlock(mutex);
    uv_sem_wait(&c->sem_signaled);
    return 0;
  }
  puVar2 = &local_28;
  condvar_wait_cold_1();
  (*(code *)puVar2[0x15])();
  iVar1 = (*(code *)puVar2[0x16])(puVar2,puVar2 + 0x14);
  return iVar1;
}

Assistant:

static int condvar_wait(worker_config* c, const int* flag) {
  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    uv_cond_wait(&c->cond, &c->mutex);
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);

  return 0;
}